

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doNotify(Async *this,Event event)

{
  __int_type _Var1;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mqMutex_);
  switch(event) {
  case event_model:
    _Var1 = 10;
    break;
  case event_resume:
    if ((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i != 2)
    goto LAB_0011ada9;
  case event_attach:
    _Var1 = 1;
    break;
  case event_detach:
    _Var1 = 4;
    break;
  default:
    goto switchD_0011ad48_default;
  }
  LOCK();
  (this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i = _Var1;
  UNLOCK();
switchD_0011ad48_default:
  std::unique_lock<std::mutex>::unlock(&lock);
  std::condition_variable::notify_all();
  if (event == event_model) {
    std::unique_lock<std::mutex>::lock(&lock);
    while (((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i != 1 &&
           ((this->super_SolveStrategy).signal_.super___atomic_base<unsigned_int>._M_i == 0))) {
      std::condition_variable::wait((unique_lock *)&this->mqCond_);
    }
  }
LAB_0011ada9:
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

virtual void doNotify(Event event) {
		mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_);
		switch (event) {
			case event_attach: state_ = state_run;  break;
			case event_model : state_ = state_next; break;
			case event_resume: if (state_ == state_model) { state_ = state_run; break; } else { return; }
			case event_detach: state_ = state_done;  break;
		};
		lock.unlock(); // synchronize-with other threads but no need to notify under lock
		mqCond_.notify_all();
		if (event == event_model) {
			for (lock.lock(); state_ != state_run && !signal();) {
				mqCond_.wait(lock);
			}
		}
	}